

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall
r_comp::Compiler::read_class
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  Atom *this_00;
  Class _p;
  string label;
  Ptr local_1b8;
  Ptr local_1a8;
  ulong local_198;
  Class local_190;
  key_type local_148;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_128;
  Class local_110;
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  char local_a8 [16];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_98;
  ReturnType local_80;
  Iteration IStack_7c;
  Atom local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_50;
  ReturnType local_38;
  Iteration IStack_34;
  
  iVar2 = std::__cxx11::string::compare
                    ((char *)&((node->
                               super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->label);
  if (iVar2 == 0) {
    return false;
  }
  std::__cxx11::string::substr
            ((ulong)&local_148,
             (ulong)&((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->label);
  Class::Class(&local_190,ANY);
  local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar1 = object(this,&local_1a8,&local_190);
  if (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (!bVar1) {
    local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
    if (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar1 = marker(this,&local_1b8,&local_190);
    if (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0012b637;
    }
  }
  Class::Class(&local_110,ANY);
  Reference::Reference((Reference *)local_c8,(ulong)write_index,&local_190,&local_110);
  local_198 = (ulong)write_index;
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->local_references,&local_148);
  pmVar3->index = local_c8._0_8_;
  r_code::Atom::operator=(&(pmVar3->_class).atom,(Atom *)(local_c8 + 8));
  std::__cxx11::string::operator=((string *)&(pmVar3->_class).str_opcode,(string *)&local_b8);
  local_128.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar3->_class).things_to_read.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_128.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar3->_class).things_to_read.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_128.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar3->_class).things_to_read.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (pmVar3->_class).things_to_read.
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_98.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_start;
  (pmVar3->_class).things_to_read.
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (pmVar3->_class).things_to_read.
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_98.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_128);
  (pmVar3->_class).type = local_80;
  (pmVar3->_class).use_as = IStack_7c;
  r_code::Atom::operator=(&(pmVar3->cast_class).atom,local_78);
  std::__cxx11::string::operator=((string *)&(pmVar3->cast_class).str_opcode,(string *)&local_70);
  local_128.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar3->cast_class).things_to_read.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_128.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pmVar3->cast_class).things_to_read.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_128.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pmVar3->cast_class).things_to_read.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (pmVar3->cast_class).things_to_read.
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_50.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_start;
  (pmVar3->cast_class).things_to_read.
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_50.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (pmVar3->cast_class).things_to_read.
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_50.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_50.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_128);
  (pmVar3->cast_class).type = local_38;
  (pmVar3->cast_class).use_as = IStack_34;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector(&local_50)
  ;
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  r_code::Atom::~Atom(local_78);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector(&local_98)
  ;
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  r_code::Atom::~Atom((Atom *)(local_c8 + 8));
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_110.things_to_read);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.str_opcode._M_dataplus._M_p != &local_110.str_opcode.field_2) {
    operator_delete(local_110.str_opcode._M_dataplus._M_p);
  }
  r_code::Atom::~Atom(&local_110.atom);
  bVar1 = true;
  if (write) {
    this_00 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),local_198);
    r_code::Atom::operator=(this_00,&local_190.atom);
  }
LAB_0012b637:
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_190.things_to_read);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.str_opcode._M_dataplus._M_p != &local_190.str_opcode.field_2) {
    operator_delete(local_190.str_opcode._M_dataplus._M_p);
  }
  r_code::Atom::~Atom(&local_190.atom);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool Compiler::read_class(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // p always NULL.
{
    if (node->label != "") {
        std::string label = node->label.substr(0, node->label.size() - 1);
        Class _p;

        if (!object(node, _p)) {
            if (!marker(node, _p)) {
                return false;
            }
        }

        local_references[label] = Reference(write_index, _p, Class());

        if (write) {
            current_object->code[write_index] = _p.atom;
        }

        return true;
    }

    return false;
}